

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O2

void __thiscall TPZSubCompMesh::SetAnalysisSparse(TPZSubCompMesh *this,int numThreads)

{
  TPZAutoPointer<TPZLinearAnalysis> *this_00;
  TPZLinearAnalysis *pTVar1;
  TPZSubMeshAnalysis *this_01;
  TPZSSpStructMatrix<double,_TPZStructMatrixOR<double>_> *this_02;
  int64_t maxeq;
  long lVar2;
  TPZMatrix<double> *obj;
  TPZStepSolver<double> *this_03;
  TPZAutoPointer<TPZStructMatrix> str;
  TPZAutoPointer<TPZMatrix<double>_> mat;
  TPZAutoPointer<TPZMatrixSolver<double>_> autostep;
  TPZAutoPointer<TPZMatrix<double>_> local_30;
  TPZAutoPointer<TPZStructMatrix> local_28;
  
  this_01 = (TPZSubMeshAnalysis *)operator_new(0x528);
  TPZSubMeshAnalysis::TPZSubMeshAnalysis(this_01,this);
  this_00 = &this->fAnalysis;
  TPZAutoPointer<TPZLinearAnalysis>::operator=(this_00,this_01);
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer(&str,(TPZStructMatrix *)0x0);
  this_02 = (TPZSSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)operator_new(0xb8);
  TPZSSpStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (this_02,&this->super_TPZCompMesh);
  TPZAutoPointer<TPZStructMatrix>::operator=(&str,this_02);
  if (0 < numThreads) {
    *(int *)((long)&(str.fRef)->fPointer->fMesh + *(long *)(*(long *)(str.fRef)->fPointer + -0x60))
         = numThreads;
  }
  TPZCompMesh::SaddlePermute(&this->super_TPZCompMesh);
  PermuteExternalConnects(this);
  *(int *)((long)&(str.fRef)->fPointer->fMesh + *(long *)(*(long *)(str.fRef)->fPointer + -0x60)) =
       numThreads;
  maxeq = NumInternalEquations(this);
  TPZEquationFilter::SetMinMaxEq(&(str.fRef)->fPointer->fEquationFilter,0,maxeq);
  lVar2 = (**(code **)(*(long *)(str.fRef)->fPointer + 0x50))();
  if (lVar2 == 0) {
    obj = (TPZMatrix<double> *)0x0;
  }
  else {
    obj = (TPZMatrix<double> *)
          __dynamic_cast(lVar2,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&mat,obj);
  if ((mat.fRef != (TPZReference *)0x0) && ((mat.fRef)->fPointer != (TPZMatrix<double> *)0x0)) {
    TPZEquationFilter::Reset(&(str.fRef)->fPointer->fEquationFilter);
    pTVar1 = this_00->fRef->fPointer;
    local_28.fRef = str.fRef;
    LOCK();
    ((str.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((str.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZAnalysis::SetStructuralMatrix(&pTVar1->super_TPZAnalysis,&local_28);
    TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&local_28);
    this_03 = (TPZStepSolver<double> *)operator_new(0x100);
    local_30.fRef = mat.fRef;
    LOCK();
    ((mat.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((mat.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZStepSolver<double>::TPZStepSolver(this_03,&local_30);
    TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_30);
    TPZStepSolver<double>::SetDirect(this_03,ELDLt);
    TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
              ((TPZAutoPointer<TPZMatrixSolver<double>> *)&autostep,this_03);
    pTVar1 = this_00->fRef->fPointer;
    (*(pTVar1->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0x10])
              (pTVar1,(autostep.fRef)->fPointer);
    TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer(&autostep);
    TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&mat);
    TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&str);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"void TPZSubCompMesh::SetAnalysisSparse(int)");
  std::operator<<((ostream *)&std::cerr,"ERROR\n: Incompatible types. Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzsubcmesh.cpp",
             0x4fb);
}

Assistant:

void TPZSubCompMesh::SetAnalysisSparse(int numThreads)
{
    fAnalysis = new TPZSubMeshAnalysis(this);
    TPZAutoPointer<TPZStructMatrix> str = NULL;
    str = new TPZSSpStructMatrix<STATE>(this);
    if(numThreads > 0){
        str->SetNumThreads(numThreads);
    }
    
    SaddlePermute();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    PermuteExternalConnects();
    str->SetNumThreads(numThreads);
    int64_t numinternal = NumInternalEquations();
    str->EquationFilter().SetMinMaxEq(0, numinternal);
    TPZAutoPointer<TPZMatrix<STATE> > mat =
        dynamic_cast<TPZMatrix<STATE>*>(str->Create());
    if(!mat){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"ERROR\n: Incompatible types. Aborting...\n";
        DebugStop();
    }
    str->EquationFilter().Reset();
    fAnalysis->SetStructuralMatrix(str);
    TPZStepSolver<STATE> *step = new TPZStepSolver<STATE>(mat);
    step->SetDirect(ELDLt);
    TPZAutoPointer<TPZMatrixSolver<STATE> > autostep = step;
    fAnalysis->SetSolver(autostep);

}